

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphic.h
# Opt level: O0

int __thiscall
mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::add
          (updates<const_mpt::convertable_*,_mpt::graphic::hint> *this,convertable **d,hint *h)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  element *this_00;
  long local_48;
  long i_1;
  long i;
  long max;
  element *cmp;
  hint *h_local;
  convertable **d_local;
  updates<const_mpt::convertable_*,_mpt::graphic::hint> *this_local;
  
  pvVar1 = array::base(&this->super_array);
  lVar2 = length(this);
  i_1 = 0;
  while( true ) {
    if (lVar2 <= i_1) {
      local_48 = 0;
      while( true ) {
        if (lVar2 <= local_48) {
          this_00 = (element *)mpt::array::append((ulong)this,(void *)0x10);
          if (this_00 == (element *)0x0) {
            this_local._4_4_ = -4;
          }
          else {
            element::element(this_00,d,h);
            this_local._4_4_ = 2;
          }
          return this_local._4_4_;
        }
        if (*(int *)((long)pvVar1 + local_48 * 0x10 + 0xc) == 0) break;
        local_48 = local_48 + 1;
      }
      element::element((element *)((long)pvVar1 + local_48 * 0x10),d,h);
      return 0;
    }
    if (((*(int *)((long)pvVar1 + i_1 * 0x10 + 0xc) != 0) &&
        (*d == *(convertable **)((long)pvVar1 + i_1 * 0x10))) &&
       (uVar3 = mpt::graphic::hint::merge((hint *)((long)pvVar1 + i_1 * 0x10 + 8),(int)h),
       (uVar3 & 1) != 0)) break;
    i_1 = i_1 + 1;
  }
  *(int *)((long)pvVar1 + i_1 * 0x10 + 0xc) = *(int *)((long)pvVar1 + i_1 * 0x10 + 0xc) + 1;
  return 1;
}

Assistant:

int add(const T &d, const H &h = H())
	{
		element *cmp = static_cast<element *>(base());
		long max = length();
		for (long i = 0; i < max; ++i) {
			if (!cmp[i].used) {
				continue;
			}
			// different data elements
			if (d != cmp[i].data) {
				continue;
			}
			if (cmp[i].hint.merge(h)) {
				++cmp[i].used;
				return 1;
			}
		}
		for (long i = 0; i < max; ++i) {
			if (!cmp[i].used) {
				new (cmp + i) element(d, h);
				return 0;
			}
		}
		if (!(cmp = static_cast<element *>(array::append(sizeof(*cmp))))) {
			return BadOperation;
		}
		new (cmp) element(d, h);
		return 2;
	}